

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O2

int opentin(void)

{
  obj *poVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  obj *obj;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  
  if (((tin.tin)->where != '\x03') && (bVar2 = obj_here(tin.tin,(int)u.ux,(int)u.uy), bVar2 == '\0')
     ) {
    return 0;
  }
  iVar4 = tin.usedtime + 1;
  if (0x31 < tin.usedtime) {
    tin.usedtime = iVar4;
    pline("You give up your attempt to open the tin.");
    return 0;
  }
  if (iVar4 < tin.reqtime) {
    tin.usedtime = iVar4;
    return 1;
  }
  tin.usedtime = iVar4;
  if (((short)*(uint *)&(tin.tin)->field_0x4a < 0) ||
     ((((*(uint *)&(tin.tin)->field_0x4a & 1) != 0 && ((tin.tin)->spe != -1)) &&
      (uVar5 = mt_random(), (uVar5 & 7) == 0)))) {
    b_trapped("tin",0);
    pcVar8 = "destroyed";
  }
  else {
    pline("You succeed in opening the tin.");
    if ((tin.tin)->spe == '\x01') {
      if (((tin.tin)->field_0x4a & 1) == 0) {
        pline("It contains spinach.");
      }
      else {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018e4b0;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018e4ab;
          pcVar8 = " ";
LAB_0018e51f:
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0018e542;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0018e53d;
LAB_0018e548:
          pcVar6 = hcolor("green");
        }
        else {
LAB_0018e4ab:
          if (ublindf == (obj *)0x0) {
            pcVar8 = "";
          }
          else {
LAB_0018e4b0:
            pcVar8 = "";
            if (ublindf->oartifact == '\x1d') {
              pcVar8 = " ";
            }
          }
          if (u.uprops[0x1e].intrinsic == 0) goto LAB_0018e51f;
LAB_0018e53d:
          if (ublindf != (obj *)0x0) {
LAB_0018e542:
            if (ublindf->oartifact == '\x1d') goto LAB_0018e548;
          }
          pcVar6 = "";
        }
        pline("It contains some decaying%s%s substance.",pcVar8,pcVar6);
      }
      cVar3 = yn_function("Eat it?","yn",'n');
      if (cVar3 != 'n') {
        *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
        costly_tin((char *)0x0);
        if (((tin.tin)->field_0x4a & 1) == 0) {
          if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
             (u.umonnum != u.umonster)) {
            dmgtype(youmonst.data,0x24);
          }
          pline("This makes you feel like %s!");
        }
        lesshungry(600);
        gainstr(tin.tin,0,'\0');
        violated(5);
        goto LAB_0018e7e3;
      }
      if ((((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
          ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) &&
         ((*(uint *)&(tin.tin)->field_0x4a & 1) == 0)) {
        *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
      }
LAB_0018e7c1:
      if (flags.verbose != '\0') {
        pline("You discard the open tin.");
      }
    }
    else {
      iVar4 = (tin.tin)->corpsenm;
      if (iVar4 != -1) {
        if (((tin.tin)->field_0x4a & 1) == 0) {
          if ((tin.tin)->spe == -1) {
            uVar5 = 5;
          }
          else {
            uVar5 = mt_random();
            uVar5 = uVar5 % 0xf;
            iVar4 = (tin.tin)->corpsenm;
          }
        }
        else {
          uVar5 = 4;
        }
        if (((iVar4 == 0x153) && (uVar9 = 0xf, ((tin.tin)->field_0x4a & 1) == 0)) ||
           (uVar9 = uVar5, uVar5 != 4)) {
LAB_0018e68d:
          if ((((tin.tin)->spe == -1) && (((tin.tin)->field_0x4a & 2) == 0)) &&
             (uVar5 = mt_random(), uVar5 % 7 == 0)) {
            uVar9 = 4;
          }
        }
        else {
          uVar9 = 5;
          if ((iVar4 != 0xa3) && (iVar4 != 0x154)) {
            uVar9 = 4;
            goto LAB_0018e68d;
          }
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          pcVar8 = mons_mname(mons + (tin.tin)->corpsenm);
          if ((mons[(tin.tin)->corpsenm].geno & 0x1000) == 0) goto LAB_0018e741;
          pcVar6 = "";
          if ((mons[(tin.tin)->corpsenm].mflags2 & 0x80000) == 0) {
            pcVar6 = "the ";
          }
        }
        else {
          pcVar8 = rndmonnam();
LAB_0018e741:
          pcVar8 = makeplural(pcVar8);
          pcVar6 = "";
        }
        pline("It smells like %s%s.",pcVar6,pcVar8);
        cVar3 = yn_function("Eat it?","yn",'n');
        if (cVar3 != 'n') {
          victual.piece = (obj *)0x0;
          victual._20_1_ = victual._20_1_ & 0xf1;
          pcVar8 = tintxts[uVar9].txt;
          pcVar6 = mons_mname(mons + (tin.tin)->corpsenm);
          pline("You consume %s %s.",pcVar8,pcVar6);
          if ((uVar9 == 10) && (uVar5 = mt_random(), (uVar5 & 1) != 0)) {
            obj = mksobj(level,0x122,'\0','\0');
            poVar1 = tin.tin;
            uVar7 = *(uint *)&(tin.tin)->field_0x4a & 2;
            uVar5 = *(uint *)&obj->field_0x4a;
            *(uint *)&obj->field_0x4a = uVar5 & 0xfffffffd | uVar7;
            *(uint *)&obj->field_0x4a =
                 uVar5 & 0xfffffffc | uVar7 | *(uint *)&poVar1->field_0x4a & 1;
            pline("There is a free fortune cookie inside!");
            hold_another_object(obj,"It falls to the floor.",(char *)0x0,(char *)0x0);
          }
          uVar5 = (tin.tin)->corpsenm;
          cVar3 = mons[(int)uVar5].mlet;
          if ((((cVar3 == '\x02') || (cVar3 == '\n')) || (cVar3 == '\x16')) || (cVar3 == '\x19')) {
LAB_0018e934:
            uVar7 = 5;
          }
          else if (cVar3 == '7') {
            uVar7 = (uint)((uVar5 & 0xfffffffd) == 0x104) * 2 + 5;
          }
          else {
            if (cVar3 == ' ') goto LAB_0018e934;
            if (cVar3 == '*') {
              uVar7 = uVar5 == 0xd6 | 6;
            }
            else if ((cVar3 == '6') || ((uVar7 = 7, cVar3 == '\x1f' && (uVar5 != 0x9e))))
            goto LAB_0018e934;
          }
          violated(uVar7);
          poVar1 = tin.tin;
          *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
          cprefx(poVar1->corpsenm);
          cpostfx((tin.tin)->corpsenm);
          costly_tin((char *)0x0);
          if (tintxts[uVar9].nut < 0) {
            uVar5 = mt_random();
            make_vomiting((ulong)(uVar5 % 0xf + 10),'\0');
          }
          else {
            lesshungry(tintxts[uVar9].nut);
          }
          if ((uVar9 == 0xb) || (uVar9 == 0)) {
            uVar5 = rnd(0xf);
            incr_itimeout(&u.uprops[0x29].intrinsic,(ulong)uVar5);
            pcVar8 = body_part(3);
            pcVar8 = makeplural(pcVar8);
            pline("Eating deep fried food made your %s very slippery.",pcVar8);
          }
          goto LAB_0018e7e3;
        }
        if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
           ((u.umonnum != u.umonster && (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))) {
          *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
        }
        goto LAB_0018e7c1;
      }
      pline("It turns out to be empty.");
      *(uint *)&(tin.tin)->field_0x4a = *(uint *)&(tin.tin)->field_0x4a | 0x30;
    }
    pcVar8 = (char *)0x0;
  }
  costly_tin(pcVar8);
LAB_0018e7e3:
  if ((tin.tin)->where == '\x03') {
    useup(tin.tin);
  }
  else {
    useupf(tin.tin,1);
  }
  tin.tin = (obj *)0x0;
  return 0;
}

Assistant:

static int opentin(void) /* called during each move whilst opening a tin */
{
	int r;
	const char *what;
	int which;

	if (!carried(tin.tin) && !obj_here(tin.tin, u.ux, u.uy))
					/* perhaps it was stolen? */
		return 0;		/* %% probably we should use tinoid */
	if (tin.usedtime++ >= 50) {
		pline("You give up your attempt to open the tin.");
		return 0;
	}
	if (tin.usedtime < tin.reqtime)
		return 1;		/* still busy */
	if (tin.tin->otrapped ||
	   (tin.tin->cursed && tin.tin->spe != -1 && !rn2(8))) {
		b_trapped("tin", 0);
		costly_tin("destroyed");
		goto use_me;
	}
	pline("You succeed in opening the tin.");
	if (tin.tin->spe != 1) {
	    if (tin.tin->corpsenm == NON_PM) {
		pline("It turns out to be empty.");
		tin.tin->dknown = tin.tin->known = TRUE;
		costly_tin(NULL);
		goto use_me;
	    }
	    if (tin.tin->cursed) {
		r = ROTTEN_TIN;			/* always rotten if cursed */
	    } else if (tin.tin->spe == -1) {
		r = HOMEMADE_TIN;		/* player made it */
	    } else {
		r = rn2(TTSZ - 2);		/* else take your pick */
	    }
	    if (tin.tin->corpsenm == PM_GIANT_TURTLE && !tin.tin->cursed) {
		/* Giant turtles are always endangeredelicious! */
		r = DELICIOUS_SOUP_TIN;
	    }
	    if (r == ROTTEN_TIN && (tin.tin->corpsenm == PM_LIZARD ||
			tin.tin->corpsenm == PM_LICHEN))
		r = HOMEMADE_TIN;		/* lizards don't rot */
	    else if (tin.tin->spe == -1 && !tin.tin->blessed && !rn2(7))
		r = ROTTEN_TIN;			/* some homemade tins go bad */
	    which = 0;	/* 0=>plural, 1=>as-is, 2=>"the" prefix */
	    if (Hallucination) {
		what = rndmonnam();
	    } else {
		what = mons_mname(&mons[tin.tin->corpsenm]);
		if (mons[tin.tin->corpsenm].geno & G_UNIQ)
		    which = type_is_pname(&mons[tin.tin->corpsenm]) ? 1 : 2;
	    }
	    if (which == 0) what = makeplural(what);
	    pline("It smells like %s%s.", (which == 2) ? "the " : "", what);
	    if (yn("Eat it?") == 'n') {
		if (!Hallucination) tin.tin->dknown = tin.tin->known = TRUE;
		if (flags.verbose) pline("You discard the open tin.");
		costly_tin(NULL);
		goto use_me;
	    }
	    /* in case stop_occupation() was called on previous meal */
	    victual.piece = NULL;
	    victual.fullwarn = victual.eating = victual.doreset = FALSE;

	    pline("You consume %s %s.", tintxts[r].txt,
			mons_mname(&mons[tin.tin->corpsenm]));

	    /* SZECHUAN_TIN might have free fortune cookie */
	    if (r == SZECHUAN_TIN && rn2(2)) {
		struct obj *cookie = mksobj(level, FORTUNE_COOKIE, FALSE, FALSE);
		cookie->blessed = tin.tin->blessed;
		cookie->cursed = tin.tin->cursed;
#ifdef INVISIBLE_OBJECTS
		cookie->oinvis = tin.tin->oinvis;
#endif
		pline("There is a free fortune cookie inside!");
		hold_another_object(cookie, "It falls to the floor.", NULL, NULL);
	    }

	    /* KMH, conduct */
	    /* Eating a tin of monster meat breaks food-conducts here. */
	    if (!vegetarian(&mons[tin.tin->corpsenm]))
		violated(CONDUCT_VEGETARIAN);
	    else if (!vegan(&mons[tin.tin->corpsenm]))
		violated(CONDUCT_VEGAN);
	    else
		violated(CONDUCT_FOODLESS);

	    tin.tin->dknown = tin.tin->known = TRUE;
	    cprefx(tin.tin->corpsenm); cpostfx(tin.tin->corpsenm);

	    /* charge for one at pre-eating cost */
	    costly_tin(NULL);

	    /* check for vomiting added by GAN 01/16/87 */
	    if (tintxts[r].nut < 0) make_vomiting((long)rn1(15,10), FALSE);
	    else lesshungry(tintxts[r].nut);

	    if (r == 0 || r == FRENCH_FRIED_TIN) {
	        /* Assume !Glib, because you can't open tins when Glib. */
		incr_itimeout(&Glib, rnd(15));
		pline("Eating deep fried food made your %s very slippery.",
		      makeplural(body_part(FINGER)));
	    }
	} else {
	    if (tin.tin->cursed)
		pline("It contains some decaying%s%s substance.",
			Blind ? "" : " ", Blind ? "" : hcolor("green"));
	    else
		pline("It contains spinach.");

	    if (yn("Eat it?") == 'n') {
		if (!Hallucination && !tin.tin->cursed)
		    tin.tin->dknown = tin.tin->known = TRUE;
		if (flags.verbose)
		    pline("You discard the open tin.");
		costly_tin(NULL);
		goto use_me;
	    }

	    tin.tin->dknown = tin.tin->known = TRUE;
	    costly_tin(NULL);

	    if (!tin.tin->cursed)
		pline("This makes you feel like %s!",
		      Hallucination ? "Swee'pea" : "Popeye");
	    lesshungry(600);
	    gainstr(tin.tin, 0, FALSE);
	    /* Eating a tin of spinach breaks foodless-conduct here. */
	    violated(CONDUCT_FOODLESS);
	}
use_me:
	if (carried(tin.tin)) useup(tin.tin);
	else useupf(tin.tin, 1L);
	tin.tin = NULL;
	return 0;
}